

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_builder.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::java::MessageBuilderGenerator::GenerateCommonBuilderMethods
          (MessageBuilderGenerator *this,Printer *printer)

{
  btree_map<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>_>
  *this_00;
  OneofDescriptor *oneof;
  ushort *puVar1;
  btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  *this_01;
  bool bVar2;
  int iVar3;
  FieldDescriptor *pFVar4;
  Descriptor *pDVar5;
  ImmutableFieldGenerator *pIVar6;
  reference ppVar7;
  OneofGeneratorInfo *pOVar8;
  ulong uVar9;
  ulong extraout_RDX;
  Descriptor *descriptor;
  int i;
  int iVar10;
  lts_20250127 *this_02;
  int j;
  char *pcVar11;
  java *this_03;
  string_view s;
  string_view s_00;
  iterator iVar12;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  string_view text_03;
  string_view text_04;
  string_view text_05;
  string_view text_06;
  string_view text_07;
  string_view text_08;
  string_view text_09;
  string_view text_10;
  string_view text_11;
  string_view text_12;
  string_view text_13;
  string_view text_14;
  string_view text_15;
  string_view text_16;
  string_view text_17;
  string_view text_18;
  string_view text_19;
  string_view text_20;
  string_view text_21;
  string local_98;
  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator> *local_78;
  btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
  *local_70;
  string local_68;
  iterator local_48;
  char *force_builder_init;
  
  iVar10 = 0;
  pcVar11 = anon_var_dwarf_651463 + 5;
  do {
    pDVar5 = this->descriptor_;
    iVar3 = pDVar5->field_count_;
    if (iVar3 <= iVar10) {
LAB_00ba3123:
      force_builder_init = pcVar11;
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_98,this->name_resolver_,pDVar5);
      text._M_str = 
      "// Construct using $classname$.newBuilder()\nprivate Builder() {\n$force_builder_init$\n}\n\n"
      ;
      text._M_len = 0x58;
      io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
                (printer,text,(char (*) [10])0xff9b1e,&local_98,(char (*) [19])"force_builder_init",
                 &force_builder_init);
      std::__cxx11::string::~string((string *)&local_98);
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_98,this->name_resolver_,this->descriptor_);
      text_00._M_str =
           "private Builder(\n    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n  super(parent);\n$force_builder_init$\n}\n"
      ;
      text_00._M_len = 0x7a;
      io::Printer::Print<char[10],std::__cxx11::string,char[19],char_const*>
                (printer,text_00,(char (*) [10])0xff9b1e,&local_98,
                 (char (*) [19])"force_builder_init",&force_builder_init);
      std::__cxx11::string::~string((string *)&local_98);
      if (iVar10 < iVar3) {
        text_01._M_str =
             "private void maybeForceBuilderInitialization() {\n  if (com.google.protobuf.GeneratedMessage\n          .alwaysUseFieldBuilders) {\n"
        ;
        text_01._M_len = 0x81;
        io::Printer::Print<>(printer,text_01);
        printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent * 2;
        for (iVar10 = 0; iVar10 < this->descriptor_->field_count_; iVar10 = iVar10 + 1) {
          pFVar4 = Descriptor::field(this->descriptor_,iVar10);
          bVar2 = IsRealOneof(pFVar4);
          if (!bVar2) {
            pFVar4 = Descriptor::field(this->descriptor_,iVar10);
            pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(&this->field_generators_,pFVar4);
            (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0x10])(pIVar6,printer);
          }
        }
        io::Printer::Outdent(printer);
        io::Printer::Outdent(printer);
        text_02._M_str = "  }\n}\n";
        text_02._M_len = 6;
        io::Printer::Print<>(printer,text_02);
      }
      text_03._M_str = "@java.lang.Override\npublic Builder clear() {\n  super.clear();\n";
      text_03._M_len = 0x3e;
      io::Printer::Print<>(printer,text_03);
      printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
      iVar10 = this->descriptor_->field_count_ + 0x1f;
      iVar3 = iVar10 / 0x20;
      uVar9 = (long)iVar10 % 0x20 & 0xffffffff;
      this_03 = (java *)0x0;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      for (; iVar3 != (int)this_03; this_03 = (java *)(ulong)((int)this_03 + 1)) {
        GetBitFieldName_abi_cxx11_(&local_98,this_03,(int)uVar9);
        text_04._M_str = "$bit_field_name$ = 0;\n";
        text_04._M_len = 0x16;
        io::Printer::Print<char[15],std::__cxx11::string>
                  (printer,text_04,(char (*) [15])"bit_field_name",&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        uVar9 = extraout_RDX;
      }
      local_78 = &this->field_generators_;
      for (iVar10 = 0; iVar10 < this->descriptor_->field_count_; iVar10 = iVar10 + 1) {
        pFVar4 = Descriptor::field(this->descriptor_,iVar10);
        pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                           (local_78,pFVar4);
        (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0xb])(pIVar6,printer);
      }
      this_00 = &this->oneofs_;
      iVar12 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
               ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                        *)this_00);
      local_98._M_dataplus._M_p = (pointer)iVar12.node_;
      local_98._M_string_length._0_4_ = iVar12.position_;
      local_70 = (btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                  *)this_00;
      iVar12 = absl::lts_20250127::container_internal::
               btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
               ::end((btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                      *)this_00);
      local_68._M_dataplus._M_p = (pointer)iVar12.node_;
      local_68._M_string_length._0_4_ = iVar12.position_;
      while( true ) {
        bVar2 = absl::lts_20250127::container_internal::
                btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                              *)&local_98,(iterator *)&local_68);
        if (!bVar2) break;
        ppVar7 = absl::lts_20250127::container_internal::
                 btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                 ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                              *)&local_98);
        pOVar8 = Context::GetOneofGeneratorInfo(this->context_,ppVar7->second);
        text_05._M_str = "$oneof_name$Case_ = 0;\n$oneof_name$_ = null;\n";
        text_05._M_len = 0x2d;
        io::Printer::Print<char[11],std::__cxx11::string>
                  (printer,text_05,(char (*) [11])0xfd8e92,&pOVar8->name);
        absl::lts_20250127::container_internal::
        btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
        ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                     *)&local_98);
      }
      io::Printer::Outdent(printer);
      text_06._M_str = "  return this;\n}\n\n";
      text_06._M_len = 0x12;
      io::Printer::Print<>(printer,text_06);
      ClassNameResolver::GetImmutableClassName<google::protobuf::FileDescriptor>
                (&local_98,this->name_resolver_,this->descriptor_->file_);
      UniqueFileScopeIdentifier_abi_cxx11_(&local_68,(java *)this->descriptor_,descriptor);
      text_07._M_str =
           "@java.lang.Override\npublic com.google.protobuf.Descriptors.Descriptor\n    getDescriptorForType() {\n  return $fileclass$.internal_$identifier$_descriptor;\n}\n\n"
      ;
      text_07._M_len = 0x9d;
      io::Printer::Print<char[10],std::__cxx11::string,char[11],std::__cxx11::string>
                (printer,text_07,(char (*) [10])"fileclass",&local_98,(char (*) [11])"identifier",
                 &local_68);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_98);
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_98,this->name_resolver_,this->descriptor_);
      text_08._M_str =
           "@java.lang.Override\npublic $classname$ getDefaultInstanceForType() {\n  return $classname$.getDefaultInstance();\n}\n\n"
      ;
      text_08._M_len = 0x73;
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,text_08,(char (*) [10])0xff9b1e,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                (&local_98,this->name_resolver_,this->descriptor_);
      text_09._M_str =
           "@java.lang.Override\npublic $classname$ build() {\n  $classname$ result = buildPartial();\n  if (!result.isInitialized()) {\n    throw newUninitializedMessageException(result);\n  }\n  return result;\n}\n\n"
      ;
      text_09._M_len = 0xc5;
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,text_09,(char (*) [10])0xff9b1e,&local_98);
      std::__cxx11::string::~string((string *)&local_98);
      GenerateBuildPartial(this,printer);
      bVar2 = Context::HasGeneratedMethods(this->context_,this->descriptor_);
      if (bVar2) {
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  (&local_98,this->name_resolver_,this->descriptor_);
        text_10._M_str =
             "@java.lang.Override\npublic Builder mergeFrom(com.google.protobuf.Message other) {\n  if (other instanceof $classname$) {\n    return mergeFrom(($classname$)other);\n  } else {\n    super.mergeFrom(other);\n    return this;\n  }\n}\n\n"
        ;
        text_10._M_len = 0xe1;
        io::Printer::Print<char[10],std::__cxx11::string>
                  (printer,text_10,(char (*) [10])0xff9b1e,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        ClassNameResolver::GetImmutableClassName<google::protobuf::Descriptor>
                  (&local_98,this->name_resolver_,this->descriptor_);
        text_11._M_str =
             "public Builder mergeFrom($classname$ other) {\n  if (other == $classname$.getDefaultInstance()) return this;\n"
        ;
        text_11._M_len = 0x6c;
        io::Printer::Print<char[10],std::__cxx11::string>
                  (printer,text_11,(char (*) [10])0xff9b1e,&local_98);
        std::__cxx11::string::~string((string *)&local_98);
        printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
        for (iVar10 = 0; this_01 = local_70, iVar10 < this->descriptor_->field_count_;
            iVar10 = iVar10 + 1) {
          pFVar4 = Descriptor::field(this->descriptor_,iVar10);
          bVar2 = IsRealOneof(pFVar4);
          if (!bVar2) {
            pFVar4 = Descriptor::field(this->descriptor_,iVar10);
            pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(local_78,pFVar4);
            (*(pIVar6->super_FieldGenerator)._vptr_FieldGenerator[0xc])(pIVar6,printer);
          }
        }
        iVar12 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                 ::begin(local_70);
        local_68._M_dataplus._M_p = (pointer)iVar12.node_;
        local_68._M_string_length._0_4_ = iVar12.position_;
        iVar12 = absl::lts_20250127::container_internal::
                 btree<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>
                 ::end(this_01);
        local_48.node_ = iVar12.node_;
        local_48.position_ = iVar12.position_;
        while( true ) {
          bVar2 = absl::lts_20250127::container_internal::
                  btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                  ::operator!=((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                *)&local_68,&local_48);
          if (!bVar2) break;
          ppVar7 = absl::lts_20250127::container_internal::
                   btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                   ::operator*((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                                *)&local_68);
          oneof = ppVar7->second;
          pOVar8 = Context::GetOneofGeneratorInfo(this->context_,oneof);
          pcVar11 = "oneof_capitalized_name";
          text_12._M_str = "switch (other.get$oneof_capitalized_name$Case()) {\n";
          text_12._M_len = 0x33;
          io::Printer::Print<char[23],std::__cxx11::string>
                    (printer,text_12,(char (*) [23])"oneof_capitalized_name",
                     &pOVar8->capitalized_name);
          printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
          for (iVar10 = 0; iVar10 < oneof->field_count_; iVar10 = iVar10 + 1) {
            pFVar4 = OneofDescriptor::field(oneof,iVar10);
            puVar1 = (ushort *)(pFVar4->all_names_).payload_;
            this_02 = (lts_20250127 *)(ulong)*puVar1;
            s._M_len = (long)puVar1 + ~(ulong)this_02;
            s._M_str = pcVar11;
            absl::lts_20250127::AsciiStrToUpper_abi_cxx11_(&local_98,this_02,s);
            text_13._M_str = "case $field_name$: {\n";
            text_13._M_len = 0x15;
            io::Printer::Print<char[11],std::__cxx11::string>
                      (printer,text_13,(char (*) [11])0x1026cd3,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            printer->indent_ = printer->indent_ + (printer->options_).spaces_per_indent;
            pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
                     get(local_78,pFVar4);
            pcVar11 = (char *)(pIVar6->super_FieldGenerator)._vptr_FieldGenerator;
            (**(_func_int **)((long)pcVar11 + 0x60))(pIVar6,printer);
            text_14._M_str = "break;\n";
            text_14._M_len = 7;
            io::Printer::Print<>(printer,text_14);
            io::Printer::Outdent(printer);
            text_15._M_str = "}\n";
            text_15._M_len = 2;
            io::Printer::Print<>(printer,text_15);
          }
          pOVar8 = Context::GetOneofGeneratorInfo(this->context_,oneof);
          s_00._M_str = pcVar11;
          s_00._M_len = (size_t)(pOVar8->name)._M_dataplus._M_p;
          absl::lts_20250127::AsciiStrToUpper_abi_cxx11_
                    (&local_98,(lts_20250127 *)(pOVar8->name)._M_string_length,s_00);
          text_16._M_str = "case $cap_oneof_name$_NOT_SET: {\n  break;\n}\n";
          text_16._M_len = 0x2c;
          io::Printer::Print<char[15],std::__cxx11::string>
                    (printer,text_16,(char (*) [15])"cap_oneof_name",&local_98);
          std::__cxx11::string::~string((string *)&local_98);
          io::Printer::Outdent(printer);
          text_17._M_str = "}\n";
          text_17._M_len = 2;
          io::Printer::Print<>(printer,text_17);
          absl::lts_20250127::container_internal::
          btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
          ::increment((btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,_const_google::protobuf::OneofDescriptor_*,_std::less<int>,_std::allocator<std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_>,_256,_false>_>,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_&,_std::pair<const_int,_const_google::protobuf::OneofDescriptor_*>_*>
                       *)&local_68);
        }
        io::Printer::Outdent(printer);
        if (0 < this->descriptor_->extension_range_count_) {
          text_18._M_str = "  this.mergeExtensionFields(other);\n";
          text_18._M_len = 0x24;
          io::Printer::Print<>(printer,text_18);
        }
        text_19._M_str = "  this.mergeUnknownFields(other.getUnknownFields());\n";
        text_19._M_len = 0x35;
        io::Printer::Print<>(printer,text_19);
        text_20._M_str = "  onChanged();\n";
        text_20._M_len = 0xf;
        io::Printer::Print<>(printer,text_20);
        text_21._M_str = "  return this;\n}\n\n";
        text_21._M_len = 0x12;
        io::Printer::Print<>(printer,text_21);
      }
      return;
    }
    pFVar4 = Descriptor::field(pDVar5,iVar10);
    pDVar5 = FieldDescriptor::message_type(pFVar4);
    if (pDVar5 != (Descriptor *)0x0) {
      pFVar4 = Descriptor::field(this->descriptor_,iVar10);
      bVar2 = IsRealOneof(pFVar4);
      if (!bVar2) {
        pFVar4 = Descriptor::field(this->descriptor_,iVar10);
        bVar2 = HasHasbit(pFVar4);
        if (bVar2) {
          pDVar5 = this->descriptor_;
          pcVar11 = "  maybeForceBuilderInitialization();";
          goto LAB_00ba3123;
        }
      }
    }
    iVar10 = iVar10 + 1;
  } while( true );
}

Assistant:

void MessageBuilderGenerator::GenerateCommonBuilderMethods(
    io::Printer* printer) {
  // Decide if we really need to have the "maybeForceBuilderInitialization()"
  // method.
  // TODO: Remove the need for this entirely
  bool need_maybe_force_builder_init = false;
  for (int i = 0; i < descriptor_->field_count(); i++) {
    if (descriptor_->field(i)->message_type() != nullptr &&
        !IsRealOneof(descriptor_->field(i)) &&
        HasHasbit(descriptor_->field(i))) {
      need_maybe_force_builder_init = true;
      break;
    }
  }

  const char* force_builder_init = need_maybe_force_builder_init
                                       ? "  maybeForceBuilderInitialization();"
                                       : "";

  printer->Print(
      "// Construct using $classname$.newBuilder()\n"
      "private Builder() {\n"
      "$force_builder_init$\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  printer->Print(
      "private Builder(\n"
      "    com.google.protobuf.GeneratedMessage.BuilderParent parent) {\n"
      "  super(parent);\n"
      "$force_builder_init$\n"
      "}\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "force_builder_init", force_builder_init);

  if (need_maybe_force_builder_init) {
    printer->Print(
        "private void maybeForceBuilderInitialization() {\n"
        "  if (com.google.protobuf.GeneratedMessage\n"
        "          .alwaysUseFieldBuilders) {\n");

    printer->Indent();
    printer->Indent();
    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateFieldBuilderInitializationCode(printer);
      }
    }
    printer->Outdent();
    printer->Outdent();

    printer->Print(
        "  }\n"
        "}\n");
  }

  printer->Print(
      "@java.lang.Override\n"
      "public Builder clear() {\n"
      "  super.clear();\n");

  printer->Indent();
  int totalBuilderInts = (descriptor_->field_count() + 31) / 32;
  for (int i = 0; i < totalBuilderInts; i++) {
    printer->Print("$bit_field_name$ = 0;\n", "bit_field_name",
                   GetBitFieldName(i));
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderClearCode(printer);
  }

  for (auto& kv : oneofs_) {
    printer->Print(
        "$oneof_name$Case_ = 0;\n"
        "$oneof_name$_ = null;\n",
        "oneof_name", context_->GetOneofGeneratorInfo(kv.second)->name);
  }

  printer->Outdent();

  printer->Print(
      "  return this;\n"
      "}\n"
      "\n");

  printer->Print(
      "@java.lang.Override\n"
      "public com.google.protobuf.Descriptors.Descriptor\n"
      "    getDescriptorForType() {\n"
      "  return $fileclass$.internal_$identifier$_descriptor;\n"
      "}\n"
      "\n",
      "fileclass", name_resolver_->GetImmutableClassName(descriptor_->file()),
      "identifier", UniqueFileScopeIdentifier(descriptor_));

  // LITE runtime implements this in GeneratedMessageLite.
  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ getDefaultInstanceForType() {\n"
      "  return $classname$.getDefaultInstance();\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  printer->Print(
      "@java.lang.Override\n"
      "public $classname$ build() {\n"
      "  $classname$ result = buildPartial();\n"
      "  if (!result.isInitialized()) {\n"
      "    throw newUninitializedMessageException(result);\n"
      "  }\n"
      "  return result;\n"
      "}\n"
      "\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_));

  GenerateBuildPartial(printer);

  // -----------------------------------------------------------------

  if (context_->HasGeneratedMethods(descriptor_)) {
    printer->Print(
        "@java.lang.Override\n"
        "public Builder mergeFrom(com.google.protobuf.Message other) {\n"
        "  if (other instanceof $classname$) {\n"
        "    return mergeFrom(($classname$)other);\n"
        "  } else {\n"
        "    super.mergeFrom(other);\n"
        "    return this;\n"
        "  }\n"
        "}\n"
        "\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));

    printer->Print(
        "public Builder mergeFrom($classname$ other) {\n"
        // Optimization:  If other is the default instance, we know none of its
        //   fields are set so we can skip the merge.
        "  if (other == $classname$.getDefaultInstance()) return this;\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_));
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      if (!IsRealOneof(descriptor_->field(i))) {
        field_generators_.get(descriptor_->field(i))
            .GenerateMergingCode(printer);
      }
    }

    // Merge oneof fields.
    for (auto& kv : oneofs_) {
      const OneofDescriptor* oneof = kv.second;
      printer->Print("switch (other.get$oneof_capitalized_name$Case()) {\n",
                     "oneof_capitalized_name",
                     context_->GetOneofGeneratorInfo(oneof)->capitalized_name);
      printer->Indent();
      for (int j = 0; j < oneof->field_count(); j++) {
        const FieldDescriptor* field = oneof->field(j);
        printer->Print("case $field_name$: {\n", "field_name",
                       absl::AsciiStrToUpper(field->name()));
        printer->Indent();
        field_generators_.get(field).GenerateMergingCode(printer);
        printer->Print("break;\n");
        printer->Outdent();
        printer->Print("}\n");
      }
      printer->Print(
          "case $cap_oneof_name$_NOT_SET: {\n"
          "  break;\n"
          "}\n",
          "cap_oneof_name",
          absl::AsciiStrToUpper(context_->GetOneofGeneratorInfo(oneof)->name));
      printer->Outdent();
      printer->Print("}\n");
    }

    printer->Outdent();

    // if message type has extensions
    if (descriptor_->extension_range_count() > 0) {
      printer->Print("  this.mergeExtensionFields(other);\n");
    }

    printer->Print("  this.mergeUnknownFields(other.getUnknownFields());\n");

    printer->Print("  onChanged();\n");

    printer->Print(
        "  return this;\n"
        "}\n"
        "\n");
  }
}